

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMiscTest_InterpretedOptions_Test::
~ParseMiscTest_InterpretedOptions_Test(ParseMiscTest_InterpretedOptions_Test *this)

{
  ZeroCopyInputStream *pZVar1;
  
  (this->super_ParseMiscTest).super_Test._vptr_Test = (_func_int **)&PTR__ParserTest_01937440;
  std::
  unique_ptr<google::protobuf::compiler::Parser,_std::default_delete<google::protobuf::compiler::Parser>_>
  ::~unique_ptr(&(this->super_ParseMiscTest).parser_);
  std::
  unique_ptr<google::protobuf::io::Tokenizer,_std::default_delete<google::protobuf::io::Tokenizer>_>
  ::~unique_ptr(&(this->super_ParseMiscTest).input_);
  pZVar1 = (this->super_ParseMiscTest).raw_input_._M_t.
           super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
           .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl;
  if (pZVar1 != (ZeroCopyInputStream *)0x0) {
    (*pZVar1->_vptr_ZeroCopyInputStream[1])();
  }
  (this->super_ParseMiscTest).raw_input_._M_t.
  super___uniq_ptr_impl<google::protobuf::io::ZeroCopyInputStream,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyInputStream>_>
  .super__Head_base<0UL,_google::protobuf::io::ZeroCopyInputStream_*,_false>._M_head_impl =
       (ZeroCopyInputStream *)0x0;
  DescriptorPool::~DescriptorPool(&(this->super_ParseMiscTest).pool_);
  MockErrorCollector::~MockErrorCollector
            ((MockErrorCollector *)&(this->super_ParseMiscTest).error_collector_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseMiscTest, InterpretedOptions) {
  // Since we're importing the generated code from parsing/compiling
  // unittest_custom_options.proto, we can just look at the option
  // values from that file's descriptor in the generated code.
  {
    const MessageOptions& options =
        proto2_unittest::SettingRealsFromInf ::descriptor()->options();
    float float_val = options.GetExtension(proto2_unittest::float_opt);
    ASSERT_TRUE(std::isinf(float_val));
    ASSERT_GT(float_val, 0);
    double double_val = options.GetExtension(proto2_unittest::double_opt);
    ASSERT_TRUE(std::isinf(double_val));
    ASSERT_GT(double_val, 0);
  }
  {
    const MessageOptions& options =
        proto2_unittest::SettingRealsFromNegativeInf ::descriptor()->options();
    float float_val = options.GetExtension(proto2_unittest::float_opt);
    ASSERT_TRUE(std::isinf(float_val));
    ASSERT_LT(float_val, 0);
    double double_val = options.GetExtension(proto2_unittest::double_opt);
    ASSERT_TRUE(std::isinf(double_val));
    ASSERT_LT(double_val, 0);
  }
  {
    const MessageOptions& options =
        proto2_unittest::SettingRealsFromNan ::descriptor()->options();
    float float_val = options.GetExtension(proto2_unittest::float_opt);
    ASSERT_TRUE(std::isnan(float_val));
    double double_val = options.GetExtension(proto2_unittest::double_opt);
    ASSERT_TRUE(std::isnan(double_val));
  }
  {
    const MessageOptions& options =
        proto2_unittest::SettingRealsFromNegativeNan ::descriptor()->options();
    float float_val = options.GetExtension(proto2_unittest::float_opt);
    ASSERT_TRUE(std::isnan(float_val));
    double double_val = options.GetExtension(proto2_unittest::double_opt);
    ASSERT_TRUE(std::isnan(double_val));
  }
}